

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::StartGroup(JunitReporter *this,string *groupName)

{
  reference pvVar1;
  Stats local_78;
  string *local_18;
  string *groupName_local;
  JunitReporter *this_local;
  
  local_18 = groupName;
  groupName_local = (string *)this;
  Stats::Stats(&local_78,groupName);
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::push_back
            (&this->m_statsForSuites,&local_78);
  Stats::~Stats(&local_78);
  pvVar1 = std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
           back(&this->m_statsForSuites);
  this->m_currentStats = pvVar1;
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_statsForSuites.push_back( Stats( groupName ) );
            m_currentStats = &m_statsForSuites.back();
        }